

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering_inotify_poller.cc
# Opt level: O2

optional<InotifyEvent> * __thiscall
FilteringInotifyPoller::GetNextEvent
          (optional<InotifyEvent> *__return_storage_ptr__,FilteringInotifyPoller *this)

{
  bool bVar1;
  _Optional_base<InotifyEvent,_true> local_60;
  
  (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>)._M_engaged = false;
  do {
    (*this->ip_->_vptr_InotifyPoller[3])(&local_60);
    std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::operator=
              (&__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>,&local_60);
    if ((__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>)._M_engaged != true) {
      std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::~_Optional_base
                (&local_60);
      return __return_storage_ptr__;
    }
    bVar1 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (&(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0.
                        _M_payload.path,&this->regex_,0);
    std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::~_Optional_base
              (&local_60);
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

std::experimental::optional<InotifyEvent>
FilteringInotifyPoller::GetNextEvent() {
  // Skip all events that have matching pathnames.
  std::experimental::optional<InotifyEvent> event;
  while ((event = ip_->GetNextEvent()) &&
         std::regex_search(event->path, regex_))
    ;
  return event;
}